

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

void passf4_ps(int ido,int l1,v4sf *cc,v4sf *ch,float *wa1,float *wa2,float *wa3,float fsign)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  v4sf *pafVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  v4sf *pafVar11;
  int iVar12;
  v4sf *pafVar13;
  v4sf *pafVar14;
  v4sf *pafVar15;
  v4sf *pafVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  
  iVar7 = l1 * ido;
  iVar8 = iVar7 * 2;
  if (ido == 2) {
    lVar10 = 0;
    for (iVar12 = 0; iVar12 < iVar7; iVar12 = iVar12 + 2) {
      pfVar2 = cc[4] + lVar10;
      pfVar1 = *cc + lVar10;
      pfVar3 = cc[1] + lVar10;
      pfVar4 = cc[2] + lVar10;
      pfVar5 = cc[3] + lVar10;
      fVar21 = *pfVar1 - *pfVar2;
      fVar22 = pfVar1[1] - pfVar2[1];
      fVar23 = pfVar1[2] - pfVar2[2];
      fVar24 = pfVar1[3] - pfVar2[3];
      fVar25 = *pfVar1 + *pfVar2;
      fVar26 = pfVar1[1] + pfVar2[1];
      fVar27 = pfVar1[2] + pfVar2[2];
      fVar28 = pfVar1[3] + pfVar2[3];
      pfVar1 = cc[5] + lVar10;
      fVar29 = *pfVar3 - *pfVar1;
      fVar30 = pfVar3[1] - pfVar1[1];
      fVar31 = pfVar3[2] - pfVar1[2];
      fVar32 = pfVar3[3] - pfVar1[3];
      fVar17 = *pfVar3 + *pfVar1;
      fVar18 = pfVar3[1] + pfVar1[1];
      fVar19 = pfVar3[2] + pfVar1[2];
      fVar20 = pfVar3[3] + pfVar1[3];
      pfVar1 = cc[6] + lVar10;
      fVar37 = (*pfVar4 - *pfVar1) * fsign;
      fVar38 = (pfVar4[1] - pfVar1[1]) * fsign;
      fVar39 = (pfVar4[2] - pfVar1[2]) * fsign;
      fVar40 = (pfVar4[3] - pfVar1[3]) * fsign;
      pfVar2 = cc[7] + lVar10;
      fVar45 = (*pfVar2 - *pfVar5) * fsign;
      fVar46 = (pfVar2[1] - pfVar5[1]) * fsign;
      fVar47 = (pfVar2[2] - pfVar5[2]) * fsign;
      fVar48 = (pfVar2[3] - pfVar5[3]) * fsign;
      fVar33 = *pfVar4 + *pfVar1;
      fVar34 = pfVar4[1] + pfVar1[1];
      fVar35 = pfVar4[2] + pfVar1[2];
      fVar36 = pfVar4[3] + pfVar1[3];
      fVar41 = *pfVar2 + *pfVar5;
      fVar42 = pfVar2[1] + pfVar5[1];
      fVar43 = pfVar2[2] + pfVar5[2];
      fVar44 = pfVar2[3] + pfVar5[3];
      pfVar1 = (float *)((long)*ch + lVar10);
      *pfVar1 = fVar25 + fVar33;
      pfVar1[1] = fVar26 + fVar34;
      pfVar1[2] = fVar27 + fVar35;
      pfVar1[3] = fVar28 + fVar36;
      pfVar1 = (float *)((long)ch[1] + lVar10);
      *pfVar1 = fVar17 + fVar41;
      pfVar1[1] = fVar18 + fVar42;
      pfVar1[2] = fVar19 + fVar43;
      pfVar1[3] = fVar20 + fVar44;
      pfVar1 = (float *)((long)ch[iVar7] + lVar10);
      *pfVar1 = fVar21 + fVar45;
      pfVar1[1] = fVar22 + fVar46;
      pfVar1[2] = fVar23 + fVar47;
      pfVar1[3] = fVar24 + fVar48;
      pfVar1 = (float *)((long)ch[iVar7 + 1] + lVar10);
      *pfVar1 = fVar29 + fVar37;
      pfVar1[1] = fVar30 + fVar38;
      pfVar1[2] = fVar31 + fVar39;
      pfVar1[3] = fVar32 + fVar40;
      pfVar1 = (float *)((long)ch[iVar8] + lVar10);
      *pfVar1 = fVar25 - fVar33;
      pfVar1[1] = fVar26 - fVar34;
      pfVar1[2] = fVar27 - fVar35;
      pfVar1[3] = fVar28 - fVar36;
      pfVar1 = (float *)((long)ch[(long)iVar8 + 1] + lVar10);
      *pfVar1 = fVar17 - fVar41;
      pfVar1[1] = fVar18 - fVar42;
      pfVar1[2] = fVar19 - fVar43;
      pfVar1[3] = fVar20 - fVar44;
      pfVar1 = (float *)((long)ch[iVar7 * 3] + lVar10);
      *pfVar1 = fVar21 - fVar45;
      pfVar1[1] = fVar22 - fVar46;
      pfVar1[2] = fVar23 - fVar47;
      pfVar1[3] = fVar24 - fVar48;
      pfVar1 = (float *)((long)ch[iVar7 * 3 + 1] + lVar10);
      *pfVar1 = fVar29 - fVar37;
      pfVar1[1] = fVar30 - fVar38;
      pfVar1[2] = fVar31 - fVar39;
      pfVar1[3] = fVar32 - fVar40;
      lVar10 = lVar10 + 0x20;
    }
  }
  else {
    iVar12 = ido * 4;
    pafVar15 = cc + (long)(ido * 2) + 1;
    pafVar16 = cc + (long)(ido * 3) + 1;
    pafVar13 = cc + (long)ido + 1;
    pafVar14 = ch + (long)iVar7 + 1;
    pafVar6 = ch + (long)iVar8 + 1;
    pafVar11 = ch + (long)(iVar7 * 3) + 1;
    for (iVar8 = 0; iVar8 < iVar7; iVar8 = iVar8 + ido) {
      lVar10 = 0;
      for (lVar9 = 0; lVar9 < ido + -1; lVar9 = lVar9 + 2) {
        pfVar1 = *cc + lVar10;
        pfVar3 = cc[1] + lVar10;
        pfVar4 = pafVar15[-1] + lVar10;
        pfVar2 = *pafVar15 + lVar10;
        fVar19 = *pfVar1 - *pfVar4;
        fVar20 = pfVar1[1] - pfVar4[1];
        fVar21 = pfVar1[2] - pfVar4[2];
        fVar22 = pfVar1[3] - pfVar4[3];
        fVar27 = *pfVar1 + *pfVar4;
        fVar28 = pfVar1[1] + pfVar4[1];
        fVar29 = pfVar1[2] + pfVar4[2];
        fVar30 = pfVar1[3] + pfVar4[3];
        fVar23 = *pfVar3 - *pfVar2;
        fVar24 = pfVar3[1] - pfVar2[1];
        fVar25 = pfVar3[2] - pfVar2[2];
        fVar26 = pfVar3[3] - pfVar2[3];
        fVar31 = *pfVar3 + *pfVar2;
        fVar33 = pfVar3[1] + pfVar2[1];
        fVar34 = pfVar3[2] + pfVar2[2];
        fVar35 = pfVar3[3] + pfVar2[3];
        pfVar3 = pafVar16[-1] + lVar10;
        pfVar1 = *pafVar16 + lVar10;
        pfVar4 = pafVar13[-1] + lVar10;
        pfVar2 = *pafVar13 + lVar10;
        fVar41 = (*pfVar1 - *pfVar2) * fsign;
        fVar42 = (pfVar1[1] - pfVar2[1]) * fsign;
        fVar43 = (pfVar1[2] - pfVar2[2]) * fsign;
        fVar44 = (pfVar1[3] - pfVar2[3]) * fsign;
        fVar45 = (*pfVar4 - *pfVar3) * fsign;
        fVar46 = (pfVar4[1] - pfVar3[1]) * fsign;
        fVar47 = (pfVar4[2] - pfVar3[2]) * fsign;
        fVar48 = (pfVar4[3] - pfVar3[3]) * fsign;
        fVar37 = *pfVar4 + *pfVar3;
        fVar38 = pfVar4[1] + pfVar3[1];
        fVar39 = pfVar4[2] + pfVar3[2];
        fVar40 = pfVar4[3] + pfVar3[3];
        fVar17 = *pfVar1 + *pfVar2;
        fVar18 = pfVar1[1] + pfVar2[1];
        fVar32 = pfVar1[2] + pfVar2[2];
        fVar36 = pfVar1[3] + pfVar2[3];
        pfVar1 = *ch + lVar10;
        *pfVar1 = fVar27 + fVar37;
        pfVar1[1] = fVar28 + fVar38;
        pfVar1[2] = fVar29 + fVar39;
        pfVar1[3] = fVar30 + fVar40;
        fVar27 = fVar27 - fVar37;
        fVar28 = fVar28 - fVar38;
        fVar29 = fVar29 - fVar39;
        fVar30 = fVar30 - fVar40;
        pfVar1 = ch[1] + lVar10;
        *pfVar1 = fVar31 + fVar17;
        pfVar1[1] = fVar33 + fVar18;
        pfVar1[2] = fVar34 + fVar32;
        pfVar1[3] = fVar35 + fVar36;
        fVar31 = fVar31 - fVar17;
        fVar33 = fVar33 - fVar18;
        fVar34 = fVar34 - fVar32;
        fVar35 = fVar35 - fVar36;
        fVar32 = fVar19 + fVar41;
        fVar36 = fVar20 + fVar42;
        fVar37 = fVar21 + fVar43;
        fVar38 = fVar22 + fVar44;
        fVar19 = fVar19 - fVar41;
        fVar20 = fVar20 - fVar42;
        fVar21 = fVar21 - fVar43;
        fVar22 = fVar22 - fVar44;
        fVar39 = fVar23 + fVar45;
        fVar41 = fVar24 + fVar46;
        fVar42 = fVar25 + fVar47;
        fVar43 = fVar26 + fVar48;
        fVar23 = fVar23 - fVar45;
        fVar24 = fVar24 - fVar46;
        fVar25 = fVar25 - fVar47;
        fVar26 = fVar26 - fVar48;
        fVar44 = *(float *)((long)wa1 + lVar10 + 4) * fsign;
        fVar17 = *(float *)((long)wa1 + lVar10);
        fVar40 = *(float *)((long)wa2 + lVar10 + 4) * fsign;
        fVar18 = *(float *)((long)wa2 + lVar10);
        pfVar1 = pafVar14[-1] + lVar10;
        *pfVar1 = fVar32 * fVar17 - fVar44 * fVar39;
        pfVar1[1] = fVar36 * fVar17 - fVar44 * fVar41;
        pfVar1[2] = fVar37 * fVar17 - fVar44 * fVar42;
        pfVar1[3] = fVar38 * fVar17 - fVar44 * fVar43;
        pfVar1 = *pafVar14 + lVar10;
        *pfVar1 = fVar17 * fVar39 + fVar32 * fVar44;
        pfVar1[1] = fVar17 * fVar41 + fVar36 * fVar44;
        pfVar1[2] = fVar17 * fVar42 + fVar37 * fVar44;
        pfVar1[3] = fVar17 * fVar43 + fVar38 * fVar44;
        fVar32 = *(float *)((long)wa3 + lVar10 + 4) * fsign;
        fVar17 = *(float *)((long)wa3 + lVar10);
        pfVar1 = pafVar6[-1] + lVar10;
        *pfVar1 = fVar27 * fVar18 - fVar40 * fVar31;
        pfVar1[1] = fVar28 * fVar18 - fVar40 * fVar33;
        pfVar1[2] = fVar29 * fVar18 - fVar40 * fVar34;
        pfVar1[3] = fVar30 * fVar18 - fVar40 * fVar35;
        pfVar1 = *pafVar6 + lVar10;
        *pfVar1 = fVar18 * fVar31 + fVar27 * fVar40;
        pfVar1[1] = fVar18 * fVar33 + fVar28 * fVar40;
        pfVar1[2] = fVar18 * fVar34 + fVar29 * fVar40;
        pfVar1[3] = fVar18 * fVar35 + fVar30 * fVar40;
        pfVar1 = pafVar11[-1] + lVar10;
        *pfVar1 = fVar19 * fVar17 - fVar32 * fVar23;
        pfVar1[1] = fVar20 * fVar17 - fVar32 * fVar24;
        pfVar1[2] = fVar21 * fVar17 - fVar32 * fVar25;
        pfVar1[3] = fVar22 * fVar17 - fVar32 * fVar26;
        pfVar1 = *pafVar11 + lVar10;
        *pfVar1 = fVar17 * fVar23 + fVar19 * fVar32;
        pfVar1[1] = fVar17 * fVar24 + fVar20 * fVar32;
        pfVar1[2] = fVar17 * fVar25 + fVar21 * fVar32;
        pfVar1[3] = fVar17 * fVar26 + fVar22 * fVar32;
        lVar10 = lVar10 + 8;
      }
      ch = ch + ido;
      cc = cc + iVar12;
      pafVar15 = pafVar15 + iVar12;
      pafVar16 = pafVar16 + iVar12;
      pafVar13 = pafVar13 + iVar12;
      pafVar14 = pafVar14 + ido;
      pafVar6 = pafVar6 + ido;
      pafVar11 = pafVar11 + ido;
    }
  }
  return;
}

Assistant:

static NEVER_INLINE(void) passf4_ps(int ido, int l1, const v4sf *cc, v4sf *ch,
                                    const float *wa1, const float *wa2, const float *wa3, float fsign) {
  /* isign == -1 for forward transform and +1 for backward transform */

  int i, k;
  v4sf ci2, ci3, ci4, cr2, cr3, cr4, ti1, ti2, ti3, ti4, tr1, tr2, tr3, tr4;
  int l1ido = l1*ido;
  if (ido == 2) {
    for (k=0; k < l1ido; k += ido, ch += ido, cc += 4*ido) {
      tr1 = VSUB(cc[0], cc[2*ido + 0]);
      tr2 = VADD(cc[0], cc[2*ido + 0]);
      ti1 = VSUB(cc[1], cc[2*ido + 1]);
      ti2 = VADD(cc[1], cc[2*ido + 1]);
      ti4 = VMUL(VSUB(cc[1*ido + 0], cc[3*ido + 0]), LD_PS1(fsign));
      tr4 = VMUL(VSUB(cc[3*ido + 1], cc[1*ido + 1]), LD_PS1(fsign));
      tr3 = VADD(cc[ido + 0], cc[3*ido + 0]);
      ti3 = VADD(cc[ido + 1], cc[3*ido + 1]);

      ch[0*l1ido + 0] = VADD(tr2, tr3);
      ch[0*l1ido + 1] = VADD(ti2, ti3);
      ch[1*l1ido + 0] = VADD(tr1, tr4);
      ch[1*l1ido + 1] = VADD(ti1, ti4);
      ch[2*l1ido + 0] = VSUB(tr2, tr3);
      ch[2*l1ido + 1] = VSUB(ti2, ti3);        
      ch[3*l1ido + 0] = VSUB(tr1, tr4);
      ch[3*l1ido + 1] = VSUB(ti1, ti4);
    }
  } else {
    for (k=0; k < l1ido; k += ido, ch+=ido, cc += 4*ido) {
      for (i=0; i<ido-1; i+=2) {
        float wr1, wi1, wr2, wi2, wr3, wi3;
        tr1 = VSUB(cc[i + 0], cc[i + 2*ido + 0]);
        tr2 = VADD(cc[i + 0], cc[i + 2*ido + 0]);
        ti1 = VSUB(cc[i + 1], cc[i + 2*ido + 1]);
        ti2 = VADD(cc[i + 1], cc[i + 2*ido + 1]);
        tr4 = VMUL(VSUB(cc[i + 3*ido + 1], cc[i + 1*ido + 1]), LD_PS1(fsign));
        ti4 = VMUL(VSUB(cc[i + 1*ido + 0], cc[i + 3*ido + 0]), LD_PS1(fsign));
        tr3 = VADD(cc[i + ido + 0], cc[i + 3*ido + 0]);
        ti3 = VADD(cc[i + ido + 1], cc[i + 3*ido + 1]);

        ch[i] = VADD(tr2, tr3);
        cr3    = VSUB(tr2, tr3);
        ch[i + 1] = VADD(ti2, ti3);
        ci3 = VSUB(ti2, ti3);

        cr2 = VADD(tr1, tr4);
        cr4 = VSUB(tr1, tr4);
        ci2 = VADD(ti1, ti4);
        ci4 = VSUB(ti1, ti4);
        wr1=wa1[i], wi1=fsign*wa1[i+1];
        VCPLXMUL(cr2, ci2, LD_PS1(wr1), LD_PS1(wi1));
        wr2=wa2[i], wi2=fsign*wa2[i+1]; 
        ch[i + l1ido] = cr2;
        ch[i + l1ido + 1] = ci2;

        VCPLXMUL(cr3, ci3, LD_PS1(wr2), LD_PS1(wi2));
        wr3=wa3[i], wi3=fsign*wa3[i+1]; 
        ch[i + 2*l1ido] = cr3;
        ch[i + 2*l1ido + 1] = ci3;

        VCPLXMUL(cr4, ci4, LD_PS1(wr3), LD_PS1(wi3));
        ch[i + 3*l1ido] = cr4;
        ch[i + 3*l1ido + 1] = ci4;
      }
    }
  }
}